

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

string * __thiscall
mxx::file_block_decompose_abi_cxx11_
          (string *__return_storage_ptr__,mxx *this,char *filename,MPI_Comm comm,
          size_t max_local_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pos_type pVar6;
  streampos start;
  int rank;
  int p;
  rangebuf rb;
  stringstream ss;
  ifstream t;
  int local_420;
  int local_41c;
  rangebuf local_418;
  stringstream local_3c0 [16];
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  streambuf local_228 [504];
  
  pVar6 = get_filesize((char *)this);
  uVar1 = pVar6._M_off;
  MPI_Comm_size(filename,&local_41c,pVar6._M_state);
  MPI_Comm_rank(filename,&local_420);
  uVar2 = (ulong)local_41c;
  if ((comm != (MPI_Comm)0x0) && (comm < (MPI_Comm)(uVar1 / uVar2))) {
    uVar1 = uVar2 * (long)comm;
  }
  uVar5 = (ulong)local_420;
  uVar3 = uVar1 % uVar2;
  uVar4 = uVar3;
  if (uVar5 <= uVar3) {
    uVar4 = uVar5;
  }
  std::ifstream::ifstream(local_238,(char *)this,_S_in);
  start._M_state.__count = 0;
  start._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  start._M_off = uVar5 * (uVar1 / uVar2) + uVar4;
  rangebuf::rangebuf(&local_418,start,(ulong)(uVar5 < uVar3) + uVar1 / uVar2,local_228);
  std::__cxx11::stringstream::stringstream(local_3c0);
  std::ostream::operator<<(local_3b0,&local_418.super_streambuf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ios_base::~ios_base(local_340);
  rangebuf::~rangebuf(&local_418);
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string file_block_decompose(const char* filename, MPI_Comm comm = MPI_COMM_WORLD, std::size_t max_local_size = 0)
{
    // TODO: handle error if file doesn't exist

    // get size of input file
    std::size_t file_size = get_filesize(filename);

    // get communication parameters
    int p, rank;
    MPI_Comm_size(comm, &p);
    MPI_Comm_rank(comm, &rank);

    // restrict max local size (assuming that it is the same parameter on each
    // processor)
    if (max_local_size > 0 && file_size / p > max_local_size)
        file_size = p*max_local_size;
    partition::block_decomposition<std::size_t> part(file_size, p, rank);
    // block decompose
    std::size_t local_size = part.local_size();
    std::size_t offset = part.excl_prefix_size();

    // open file
    std::ifstream t(filename);
    // wrap in our custom range buffer (of type std::streambuf)
    rangebuf rb(offset, local_size, t.rdbuf());

    // read file (range) buffer into string stream
    std::stringstream ss;
    ss << &rb;

    std::string local_str(ss.str());

    return local_str;
}